

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_krp.c
# Opt level: O2

err_t beltKRP(octet *dest,size_t m,octet *src,size_t n,octet *level,octet *header)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  eVar2 = 0x6d;
  if ((((m <= n) && (m < 0x21)) && ((0x101010000U >> (m & 0x3f) & 1) != 0)) &&
     ((n < 0x21 && ((0x101010000U >> (n & 0x3f) & 1) != 0)))) {
    bVar1 = memIsValid(src,n);
    if (bVar1 != 0) {
      bVar1 = memIsValid(level,0xc);
      if (bVar1 != 0) {
        bVar1 = memIsValid(header,0x10);
        if (bVar1 != 0) {
          bVar1 = memIsValid(dest,m);
          if (bVar1 != 0) {
            size = beltKRP_keep();
            state = blobCreate(size);
            if (state == (blob_t)0x0) {
              eVar2 = 0x6e;
            }
            else {
              beltKRPStart(state,src,n,level);
              beltKRPStepG(dest,m,header,state);
              blobClose(state);
              eVar2 = 0;
            }
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltKRP(octet dest[], size_t m, const octet src[], size_t n,
	const octet level[12], const octet header[16])
{
	void* state;
	// проверить входные данные
	if (m > n ||
		m != 16 && m != 24 && m != 32 ||
		n != 16 && n != 24 && n != 32 ||
		!memIsValid(src, n) ||
		!memIsValid(level, 12) ||
		!memIsValid(header, 16) ||
		!memIsValid(dest, m))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltKRP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// преобразовать ключ
	beltKRPStart(state, src, n, level);
	beltKRPStepG(dest, m, header, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}